

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

int mem_write(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (buf == (char *)0x0) {
    __assert_fail("buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x4c1,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
  }
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("mem_write(%p, %p, %u)\n",obj,buf,(ulong)cnt);
  }
  uVar6 = (ulong)cnt;
  uVar2 = *(long *)((long)obj + 0x18) + uVar6;
  uVar4 = *(ulong *)((long)obj + 8);
  if ((uVar4 < uVar2) && (uVar5 = uVar4, *(int *)((long)obj + 0x20) != 0)) {
    do {
      if (uVar2 <= uVar5) {
        if (99 < iVar1) {
          jas_eprintf("mem_write resizing from %d to %zu\n",uVar4,uVar5);
        }
        if (uVar5 == 0) {
          __assert_fail("newbufsize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                        ,0x4d0,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
        }
        if (99 < iVar1) {
          jas_eprintf("mem_resize(%p, %zu)\n",obj,uVar5);
        }
        pvVar3 = jas_realloc2(*obj,uVar5,1);
        if (pvVar3 == (void *)0x0) {
          if (99 < iVar1) {
            jas_eprintf("mem_resize realloc failed\n");
          }
        }
        else {
          if (99 < iVar1) {
            jas_eprintf("mem_resize realloc succeeded\n");
          }
          *(void **)obj = pvVar3;
          *(ulong *)((long)obj + 8) = uVar5;
        }
        if (pvVar3 != (void *)0x0) goto LAB_0011417d;
        uVar4 = 0xffffffff;
        goto LAB_001141f7;
      }
      bVar7 = -1 < (long)uVar5;
      uVar5 = uVar5 << (-1 < (long)uVar5);
    } while (bVar7);
    uVar4 = 0xffffffff;
    if (99 < iVar1) {
      jas_eprintf("new buffer size would cause overflow\n");
    }
  }
  else {
LAB_0011417d:
    uVar4 = *(ulong *)((long)obj + 0x10);
    uVar2 = *(ulong *)((long)obj + 0x18);
    if (uVar4 < uVar2) {
      uVar5 = *(ulong *)((long)obj + 8);
      if (uVar5 != uVar4) {
        if (uVar2 < uVar5) {
          uVar5 = uVar2;
        }
        memset((void *)(uVar4 + *obj),0,uVar5 - uVar4);
        *(long *)((long)obj + 0x10) = *(long *)((long)obj + 0x10) + (uVar5 - uVar4);
      }
      uVar4 = 0;
      if (*(long *)((long)obj + 0x18) != *(long *)((long)obj + 0x10)) goto LAB_001141f7;
    }
    uVar4 = *(long *)((long)obj + 8) - *(long *)((long)obj + 0x18);
    if (uVar6 <= uVar4) {
      uVar4 = uVar6;
    }
    if (uVar4 != 0) {
      memcpy((void *)(*(long *)((long)obj + 0x18) + *obj),buf,uVar4);
      *(long *)((long)obj + 0x18) = *(long *)((long)obj + 0x18) + uVar4;
    }
    if (*(ulong *)((long)obj + 0x10) < *(ulong *)((long)obj + 0x18)) {
      *(ulong *)((long)obj + 0x10) = *(ulong *)((long)obj + 0x18);
    }
    if ((uint)uVar4 != cnt) {
      __assert_fail("ret == cnt",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                    ,0x4eb,"int mem_write(jas_stream_obj_t *, char *, unsigned int)");
    }
  }
LAB_001141f7:
  return (int)uVar4;
}

Assistant:

static int mem_write(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	size_t n;
	jas_stream_memobj_t *m = (jas_stream_memobj_t *)obj;
	size_t newbufsize;
	size_t newpos;

	assert(buf);

	JAS_DBGLOG(100, ("mem_write(%p, %p, %u)\n", obj, buf, cnt));
	newpos = m->pos_ + cnt;
	if (newpos > m->bufsize_ && m->growable_) {
		newbufsize = m->bufsize_;
		while (newbufsize < newpos) {
			//newbufsize <<= 1;
			if (!jas_safe_size_mul(newbufsize, 2, &newbufsize)) {
				JAS_DBGLOG(100, ("new buffer size would cause overflow\n"));
				return -1;
			}
		}
		JAS_DBGLOG(100, ("mem_write resizing from %d to %zu\n", m->bufsize_,
		  newbufsize));
		assert(newbufsize > 0);
		if (mem_resize(m, newbufsize)) {
			return -1;
		}
	}
	if (m->pos_ > m->len_) {
		/* The current position is beyond the end of the file, so
		  pad the file to the current position with zeros. */
		n = JAS_MIN(m->pos_, m->bufsize_) - m->len_;
		if (n > 0) {
			memset(&m->buf_[m->len_], 0, n);
			m->len_ += n;
		}
		if (m->pos_ != m->len_) {
			/* The buffer is not big enough. */
			return 0;
		}
	}
	n = m->bufsize_ - m->pos_;
	unsigned ret = JAS_MIN(n, cnt);
	if (ret > 0) {
		memcpy(&m->buf_[m->pos_], buf, ret);
		m->pos_ += ret;
	}
	if (m->pos_ > m->len_) {
		m->len_ = m->pos_;
	}
	assert(ret == cnt);
	return ret;
}